

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O2

string * stackjit::ByteCodeGenerator::escapedString(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_70);
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    cVar1 = pcVar2[sVar4];
    if ((cVar1 == '\\') || (cVar1 == '\"')) {
      std::__cxx11::string::append((char *)&local_50);
    }
    std::__cxx11::string::push_back((char)&local_50);
  }
  std::operator+(&local_70,"\"",&local_50);
  std::operator+(__return_storage_ptr__,&local_70,"\"");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string ByteCodeGenerator::escapedString(std::string str) {
		std::string res = "";

		for (char c : str) {
			if (c == '"' || c == '\\') {
				res += "\\";
			}

			res += c;
		}

		return "\"" + res + "\"";
	}